

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_vector.h
# Opt level: O0

ostream * __thiscall bsim::unsigned_int<17>::print(unsigned_int<17> *this,ostream *out)

{
  ostream *poVar1;
  ostream *in_RSI;
  bit_vector<17> *in_stack_ffffffffffffffe8;
  
  poVar1 = bsim::operator<<(in_RSI,in_stack_ffffffffffffffe8);
  std::operator<<(poVar1,"U");
  return in_RSI;
}

Assistant:

inline std::ostream& print(std::ostream& out) const {
      out << bits << "U";
      return out;
    }